

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O3

void project_object_handler_KILL_TRAP(project_object_handler_context_t *context)

{
  _Bool _Var1;
  
  _Var1 = is_locked_chest(context->obj);
  if (_Var1) {
    unlock_chest(context->obj);
    if (context->obj->known != (object *)0x0) {
      _Var1 = ignore_item_ok(player,context->obj);
      if (!_Var1) {
        context->obj->known->pval = context->obj->pval;
        msg("Click!");
        context->obvious = true;
      }
    }
  }
  return;
}

Assistant:

static void project_object_handler_KILL_TRAP(project_object_handler_context_t *context)
{
	/* Chests are noticed only if trapped or locked */
	if (is_locked_chest(context->obj)) {
		/* Disarm or Unlock */
		unlock_chest((struct object * const)context->obj);

		/* Notice */
		if (context->obj->known
				&& !ignore_item_ok(player, context->obj)) {
			context->obj->known->pval = context->obj->pval;
			msg("Click!");
			context->obvious = true;
		}
	}
}